

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O1

CustomModel_CustomModelParamValue * __thiscall
google::protobuf::
Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomModel_CustomModelParamValue>
::operator[](Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomModel_CustomModelParamValue>
             *this,key_type *key)

{
  Value *ppvVar1;
  value_type *pvVar2;
  
  ppvVar1 = InnerMap::operator[](this->elements_,key);
  if (*ppvVar1 == (Value)0x0) {
    pvVar2 = CreateValueTypeInternal(this,key);
    *ppvVar1 = pvVar2;
  }
  return &(*ppvVar1)->second;
}

Assistant:

T& operator[](const key_type& key) {
    value_type** value =  &(*elements_)[key];
    if (*value == NULL) {
      *value = CreateValueTypeInternal(key);
      internal::MapValueInitializer<google::protobuf::is_proto_enum<T>::value,
                                    T>::Initialize((*value)->second,
                                                   default_enum_value_);
    }
    return (*value)->second;
  }